

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O3

void __thiscall
r_exec::_Mem::pack_fact_object
          (_Mem *this,Code *fact_object,Code *hlp,uint16_t *write_index,
          vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *references)

{
  pointer pPVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  _Object *p_Var4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  Atom p_atom;
  P<r_code::Code> local_50;
  ushort *local_48;
  undefined4 local_40;
  uint local_3c;
  vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *local_38;
  undefined4 extraout_var_00;
  
  local_3c = (uint)*write_index;
  local_48 = write_index;
  local_38 = (vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *)references;
  iVar3 = (*(fact_object->super__Object)._vptr__Object[6])(fact_object);
  if ((short)iVar3 != 0) {
    uVar5 = 0;
    do {
      iVar3 = (*(fact_object->super__Object)._vptr__Object[4])(fact_object,(ulong)uVar5);
      local_40 = *(undefined4 *)CONCAT44(extraout_var,iVar3);
      cVar2 = r_code::Atom::getDescriptor();
      if (cVar2 == -0x7c) {
        r_code::Atom::asIndex();
        r_code::Atom::IPointer((ushort)(Atom *)&local_50);
        iVar3 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_48);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar3),(Atom *)&local_50);
LAB_00189d90:
        r_code::Atom::~Atom((Atom *)&local_50);
      }
      else if (cVar2 == -0x7b) {
        r_code::Atom::asIndex();
        iVar3 = (*(fact_object->super__Object)._vptr__Object[9])();
        p_Var4 = (_Object *)CONCAT44(extraout_var_00,iVar3);
        pPVar1 = *(pointer *)local_38;
        if (*(pointer *)(local_38 + 8) != pPVar1) {
          uVar7 = 0;
          uVar6 = 0;
          do {
            if (pPVar1[uVar7].object == p_Var4) {
              r_code::Atom::RPointer((ushort)(Atom *)&local_50);
              iVar3 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_48);
              r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar3),(Atom *)&local_50);
              goto LAB_00189d90;
            }
            uVar6 = uVar6 + 1;
            uVar7 = (ulong)(uVar6 & 0xffff);
          } while (uVar7 < (ulong)((long)*(pointer *)(local_38 + 8) - (long)pPVar1 >> 3));
        }
        r_code::Atom::RPointer((ushort)&local_50);
        iVar3 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_48);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar3),(Atom *)&local_50);
        r_code::Atom::~Atom((Atom *)&local_50);
        if (p_Var4 != (_Object *)0x0) {
          LOCK();
          (p_Var4->refCount).super___atomic_base<long>._M_i =
               (p_Var4->refCount).super___atomic_base<long>._M_i + 1;
          UNLOCK();
        }
        local_50.object = p_Var4;
        std::vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>>::
        emplace_back<core::P<r_code::Code>>(local_38,&local_50);
        if (local_50.object != (_Object *)0x0) {
          LOCK();
          ((local_50.object)->refCount).super___atomic_base<long>._M_i =
               ((local_50.object)->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if (((local_50.object)->refCount).super___atomic_base<long>._M_i < 1) {
            (*(local_50.object)->_vptr__Object[1])();
          }
        }
      }
      else {
        iVar3 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_48);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar3),(Atom *)&local_40);
      }
      *local_48 = *local_48 + 1;
      r_code::Atom::~Atom((Atom *)&local_40);
      uVar5 = uVar5 + 1;
      iVar3 = (*(fact_object->super__Object)._vptr__Object[6])(fact_object);
    } while (uVar5 < (ushort)iVar3);
  }
  return;
}

Assistant:

void _Mem::pack_fact_object(Code *fact_object, Code *hlp, uint16_t &write_index, std::vector<P<Code> > *references) const
{
    uint16_t offset = write_index;

    for (uint16_t i = 0; i < fact_object->code_size(); ++i) {
        Atom p_atom = fact_object->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::R_PTR: { // append this reference to the hlp's if not already there.
            Code *reference = fact_object->get_reference(p_atom.asIndex());
            bool found = false;

            for (uint16_t i = 0; i < references->size(); ++i) {
                if ((*references)[i] == reference) {
                    hlp->code(write_index) = Atom::RPointer(i);
                    found = true;
                    break;
                }
            }

            if (!found) {
                hlp->code(write_index) = Atom::RPointer(references->size());
                references->push_back(reference);
            }

            ++write_index;
            break;
        }

        case Atom::I_PTR: // offset the ptr by write_index. PB HERE.
            hlp->code(write_index) = Atom::IPointer(offset + p_atom.asIndex());
            ++write_index;
            break;

        default:
            hlp->code(write_index) = p_atom;
            ++write_index;
            break;
        }
    }
}